

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O3

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,TestPath *other,int indexFirst,int count)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  int iVar3;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_00143170;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_M_initialize_map
            (&(this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>,0
            );
  uVar2 = 0;
  if (0 < indexFirst) {
    uVar2 = indexFirst;
  }
  if (count < 0) {
    iVar3 = (*other->_vptr_TestPath[10])(other);
  }
  else {
    iVar3 = (indexFirst >> 0x1f & indexFirst) + count;
  }
  while( true ) {
    if (iVar3 < 1) {
      return;
    }
    iVar1 = (*other->_vptr_TestPath[10])(other);
    if (iVar1 <= (int)uVar2) break;
    iVar1 = (*other->_vptr_TestPath[0xb])(other,(ulong)uVar2);
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
    (*this->_vptr_TestPath[3])(this,CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

TestPath::TestPath( const TestPath &other, 
                    int indexFirst, 
                    int count )
    : m_tests()
{
  int countAdjustment = 0;
  if ( indexFirst < 0 )
  {
    countAdjustment = indexFirst;
    indexFirst = 0;
  }

  if ( count < 0 )
    count = other.getTestCount();
  else
    count += countAdjustment;

  int index = indexFirst;
  while ( count-- > 0  &&  index < other.getTestCount() )
    add( other.getTestAt( index++ ) );
}